

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

int sznet::sz_cond_timewait(sz_cond_t *cond,sz_mutex_t *mutex,uint32_t millisec)

{
  int iVar1;
  int64_t nanoseconds;
  int64_t kNanoSecondsPerSecond;
  int64_t kNanoSecondsPerMilliSecond;
  timespec abstime;
  uint32_t millisec_local;
  sz_mutex_t *mutex_local;
  sz_cond_t *cond_local;
  
  abstime.tv_nsec._4_4_ = millisec;
  clock_gettime(0,(timespec *)&kNanoSecondsPerMilliSecond);
  kNanoSecondsPerMilliSecond =
       (long)(abstime.tv_sec + (ulong)abstime.tv_nsec._4_4_ * 1000000) / 1000000000 +
       kNanoSecondsPerMilliSecond;
  abstime.tv_sec = (long)(abstime.tv_sec + (ulong)abstime.tv_nsec._4_4_ * 1000000) % 1000000000;
  iVar1 = pthread_cond_timedwait
                    ((pthread_cond_t *)cond,(pthread_mutex_t *)mutex,
                     (timespec *)&kNanoSecondsPerMilliSecond);
  return iVar1;
}

Assistant:

int sz_cond_timewait(sz_cond_t* cond, sz_mutex_t* mutex, uint32_t millisec)
{
	struct timespec abstime;
	clock_gettime(CLOCK_REALTIME, &abstime);

	const int64_t kNanoSecondsPerMilliSecond = 1000000;
	const int64_t kNanoSecondsPerSecond = 1000000000;
	int64_t nanoseconds = static_cast<int64_t>(millisec * kNanoSecondsPerMilliSecond);
	abstime.tv_sec += static_cast<time_t>((abstime.tv_nsec + nanoseconds) / kNanoSecondsPerSecond);
	abstime.tv_nsec = static_cast<long>((abstime.tv_nsec + nanoseconds) % kNanoSecondsPerSecond);
	return pthread_cond_timedwait(cond, mutex, &abstime);
}